

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::
BasicResult<Catch::Clara::ParseResultType>
          (BasicResult<Catch::Clara::Detail::ParseState> *this,
          BasicResult<Catch::Clara::ParseResultType> *other)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type =
       (other->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.m_type;
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_00243ef8;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (other->m_errorMessage)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,
             pcVar1 + (other->m_errorMessage)._M_string_length);
  if ((this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("type() != ResultType::Ok",
                "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                ,0x1226,
                "Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult(const BasicResult<U> &) [T = Catch::Clara::Detail::ParseState, U = Catch::Clara::ParseResultType]"
               );
}

Assistant:

explicit BasicResult( BasicResult<U> const& other ):
                    ResultValueBase<T>( other.type() ),
                    m_errorMessage( other.errorMessage() ) {
                    assert( type() != ResultType::Ok );
                }